

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts3Offsets(sqlite3_context *pCtx,Fts3Cursor *pCsr)

{
  int iVar1;
  uchar *z;
  TermOffset *pTVar2;
  char local_f8 [8];
  char aBuffer [64];
  TermOffset *pT;
  TermOffset *pTerm;
  int local_98;
  int iMinPos;
  int i;
  int nDoc;
  char *zDoc;
  int iCurrent;
  int iEnd;
  int iStart;
  int NDUMMY;
  char *ZDUMMY;
  sqlite3_tokenizer_cursor *pC;
  TermOffsetCtx sCtx;
  StrBuffer res;
  int local_30;
  int iCol;
  int nToken;
  int rc;
  sqlite3_tokenizer_module *pMod;
  Fts3Table *pTab;
  Fts3Cursor *pCsr_local;
  sqlite3_context *pCtx_local;
  
  pMod = (sqlite3_tokenizer_module *)(pCsr->base).pVtab;
  _nToken = *(long *)pMod[1].xDestroy;
  pTab = (Fts3Table *)pCsr;
  pCsr_local = (Fts3Cursor *)pCtx;
  memset(&sCtx.aTerm,0,0x10);
  if (pTab->db == (sqlite3 *)0x0) {
    sqlite3_result_text((sqlite3_context *)pCsr_local,"",0,(_func_void_void_ptr *)0x0);
  }
  else {
    memset(&pC,0,0x20);
    iCol = fts3ExprLoadDoclists((Fts3Cursor *)pTab,(int *)0x0,&local_30);
    if (iCol == 0) {
      sCtx.iDocid = (sqlite3_int64)sqlite3_malloc64((long)local_30 << 4);
      if ((void *)sCtx.iDocid == (void *)0x0) {
        iCol = 7;
      }
      else {
        sCtx.iCol = pTab->nColumn;
        sCtx.iTerm = *(int *)&pTab->field_0x34;
        pC = (sqlite3_tokenizer_cursor *)pTab;
        for (res.nAlloc = 0; res.nAlloc < *(int *)&pMod->xLanguageid; res.nAlloc = res.nAlloc + 1) {
          iEnd = 0;
          iCurrent = 0;
          zDoc._4_4_ = 0;
          zDoc._0_4_ = 0;
          sCtx.pCsr._0_4_ = res.nAlloc;
          sCtx.pCsr._4_4_ = 0;
          fts3ExprIterate((Fts3Expr *)pTab->db,fts3ExprTermOffsetInit,&pC);
          z = sqlite3_column_text((sqlite3_stmt *)(pTab->base).zErrMsg,res.nAlloc + 1);
          iVar1 = sqlite3_column_bytes((sqlite3_stmt *)(pTab->base).zErrMsg,res.nAlloc + 1);
          if (z == (uchar *)0x0) {
            iVar1 = sqlite3_column_type((sqlite3_stmt *)(pTab->base).zErrMsg,res.nAlloc + 1);
            if (iVar1 != 5) {
              iCol = 7;
              break;
            }
          }
          else {
            iCol = sqlite3Fts3OpenTokenizer
                             ((sqlite3_tokenizer *)pMod[1].xDestroy,*(int *)&pTab->zDb,(char *)z,
                              iVar1,(sqlite3_tokenizer_cursor **)&ZDUMMY);
            if (iCol != 0) break;
            iCol = (**(code **)(_nToken + 0x28))
                             (ZDUMMY,&iStart,&iEnd,&iCurrent,(long)&zDoc + 4,&zDoc);
            while (iCol == 0) {
              pTerm._4_4_ = 0x7fffffff;
              pT = (TermOffset *)0x0;
              for (local_98 = 0; local_98 < local_30; local_98 = local_98 + 1) {
                pTVar2 = (TermOffset *)(sCtx.iDocid + (long)local_98 * 0x10);
                if ((pTVar2->pList != (char *)0x0) && (pTVar2->iPos - pTVar2->iOff < pTerm._4_4_)) {
                  pTerm._4_4_ = pTVar2->iPos - pTVar2->iOff;
                  pT = pTVar2;
                }
              }
              if (pT == (TermOffset *)0x0) {
                iCol = 0x65;
              }
              else {
                if (((int)*pT->pList & 0xfeU) == 0) {
                  pT->pList = (char *)0x0;
                }
                else {
                  fts3GetDeltaPosition(&pT->pList,&pT->iPos);
                }
                while (iCol == 0 && (int)zDoc < pTerm._4_4_) {
                  iCol = (**(code **)(_nToken + 0x28))
                                   (ZDUMMY,&iStart,&iEnd,&iCurrent,(long)&zDoc + 4,&zDoc);
                }
                if (iCol == 0) {
                  sqlite3_snprintf(0x40,local_f8,"%d %d %d %d ",(ulong)(uint)res.nAlloc,
                                   (long)pT - sCtx.iDocid >> 4,(ulong)(uint)iCurrent,
                                   zDoc._4_4_ - iCurrent);
                  iCol = fts3StringAppend((StrBuffer *)&sCtx.aTerm,local_f8,-1);
                }
                else if ((iCol == 0x65) &&
                        (pMod[1].xOpen ==
                         (_func_int_sqlite3_tokenizer_ptr_char_ptr_int_sqlite3_tokenizer_cursor_ptr_ptr
                          *)0x0)) {
                  iCol = 0x10b;
                }
              }
            }
            if (iCol == 0x65) {
              iCol = 0;
            }
            (**(code **)(_nToken + 0x20))(ZDUMMY);
            if (iCol != 0) break;
          }
        }
      }
    }
    sqlite3_free((void *)sCtx.iDocid);
    sqlite3Fts3SegmentsClose((Fts3Table *)pMod);
    if (iCol == 0) {
      sqlite3_result_text((sqlite3_context *)pCsr_local,(char *)sCtx.aTerm,(int)res.z + -1,
                          sqlite3_free);
    }
    else {
      sqlite3_result_error_code((sqlite3_context *)pCsr_local,iCol);
      sqlite3_free(sCtx.aTerm);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3Offsets(
  sqlite3_context *pCtx,          /* SQLite function call context */
  Fts3Cursor *pCsr                /* Cursor object */
){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  sqlite3_tokenizer_module const *pMod = pTab->pTokenizer->pModule;
  int rc;                         /* Return Code */
  int nToken;                     /* Number of tokens in query */
  int iCol;                       /* Column currently being processed */
  StrBuffer res = {0, 0, 0};      /* Result string */
  TermOffsetCtx sCtx;             /* Context for fts3ExprTermOffsetInit() */

  if( !pCsr->pExpr ){
    sqlite3_result_text(pCtx, "", 0, SQLITE_STATIC);
    return;
  }

  memset(&sCtx, 0, sizeof(sCtx));
  assert( pCsr->isRequireSeek==0 );

  /* Count the number of terms in the query */
  rc = fts3ExprLoadDoclists(pCsr, 0, &nToken);
  if( rc!=SQLITE_OK ) goto offsets_out;

  /* Allocate the array of TermOffset iterators. */
  sCtx.aTerm = (TermOffset *)sqlite3_malloc64(sizeof(TermOffset)*nToken);
  if( 0==sCtx.aTerm ){
    rc = SQLITE_NOMEM;
    goto offsets_out;
  }
  sCtx.iDocid = pCsr->iPrevId;
  sCtx.pCsr = pCsr;

  /* Loop through the table columns, appending offset information to 
  ** string-buffer res for each column.
  */
  for(iCol=0; iCol<pTab->nColumn; iCol++){
    sqlite3_tokenizer_cursor *pC; /* Tokenizer cursor */
    const char *ZDUMMY;           /* Dummy argument used with xNext() */
    int NDUMMY = 0;               /* Dummy argument used with xNext() */
    int iStart = 0;
    int iEnd = 0;
    int iCurrent = 0;
    const char *zDoc;
    int nDoc;

    /* Initialize the contents of sCtx.aTerm[] for column iCol. There is 
    ** no way that this operation can fail, so the return code from
    ** fts3ExprIterate() can be discarded.
    */
    sCtx.iCol = iCol;
    sCtx.iTerm = 0;
    (void)fts3ExprIterate(pCsr->pExpr, fts3ExprTermOffsetInit, (void*)&sCtx);

    /* Retreive the text stored in column iCol. If an SQL NULL is stored 
    ** in column iCol, jump immediately to the next iteration of the loop.
    ** If an OOM occurs while retrieving the data (this can happen if SQLite
    ** needs to transform the data from utf-16 to utf-8), return SQLITE_NOMEM 
    ** to the caller. 
    */
    zDoc = (const char *)sqlite3_column_text(pCsr->pStmt, iCol+1);
    nDoc = sqlite3_column_bytes(pCsr->pStmt, iCol+1);
    if( zDoc==0 ){
      if( sqlite3_column_type(pCsr->pStmt, iCol+1)==SQLITE_NULL ){
        continue;
      }
      rc = SQLITE_NOMEM;
      goto offsets_out;
    }

    /* Initialize a tokenizer iterator to iterate through column iCol. */
    rc = sqlite3Fts3OpenTokenizer(pTab->pTokenizer, pCsr->iLangid,
        zDoc, nDoc, &pC
    );
    if( rc!=SQLITE_OK ) goto offsets_out;

    rc = pMod->xNext(pC, &ZDUMMY, &NDUMMY, &iStart, &iEnd, &iCurrent);
    while( rc==SQLITE_OK ){
      int i;                      /* Used to loop through terms */
      int iMinPos = 0x7FFFFFFF;   /* Position of next token */
      TermOffset *pTerm = 0;      /* TermOffset associated with next token */

      for(i=0; i<nToken; i++){
        TermOffset *pT = &sCtx.aTerm[i];
        if( pT->pList && (pT->iPos-pT->iOff)<iMinPos ){
          iMinPos = pT->iPos-pT->iOff;
          pTerm = pT;
        }
      }

      if( !pTerm ){
        /* All offsets for this column have been gathered. */
        rc = SQLITE_DONE;
      }else{
        assert_fts3_nc( iCurrent<=iMinPos );
        if( 0==(0xFE&*pTerm->pList) ){
          pTerm->pList = 0;
        }else{
          fts3GetDeltaPosition(&pTerm->pList, &pTerm->iPos);
        }
        while( rc==SQLITE_OK && iCurrent<iMinPos ){
          rc = pMod->xNext(pC, &ZDUMMY, &NDUMMY, &iStart, &iEnd, &iCurrent);
        }
        if( rc==SQLITE_OK ){
          char aBuffer[64];
          sqlite3_snprintf(sizeof(aBuffer), aBuffer, 
              "%d %d %d %d ", iCol, pTerm-sCtx.aTerm, iStart, iEnd-iStart
          );
          rc = fts3StringAppend(&res, aBuffer, -1);
        }else if( rc==SQLITE_DONE && pTab->zContentTbl==0 ){
          rc = FTS_CORRUPT_VTAB;
        }
      }
    }
    if( rc==SQLITE_DONE ){
      rc = SQLITE_OK;
    }

    pMod->xClose(pC);
    if( rc!=SQLITE_OK ) goto offsets_out;
  }

 offsets_out:
  sqlite3_free(sCtx.aTerm);
  assert( rc!=SQLITE_DONE );
  sqlite3Fts3SegmentsClose(pTab);
  if( rc!=SQLITE_OK ){
    sqlite3_result_error_code(pCtx,  rc);
    sqlite3_free(res.z);
  }else{
    sqlite3_result_text(pCtx, res.z, res.n-1, sqlite3_free);
  }
  return;
}